

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pesPacket.h
# Opt level: O0

int64_t get_pts(uint8_t *p)

{
  int val;
  int64_t pts;
  uint8_t *p_local;
  
  return (long)((int)(uint)CONCAT11(p[3],p[4]) >> 1) |
         (long)(((int)(uint)CONCAT11(p[1],p[2]) >> 1) << 0xf) |
         (long)(int)((int)(uint)*p >> 1 & 7) << 0x1e;
}

Assistant:

static int64_t get_pts(const uint8_t *p)
{
    auto pts = static_cast<int64_t>((p[0] >> 1) & 0x07) << 30;
    int val = p[1] << 8 | p[2];
    pts |= (val >> 1) << 15;
    val = p[3] << 8 | p[4];
    pts |= val >> 1;
    return pts;
}